

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cst_controller.cpp
# Opt level: O0

void __thiscall
r_exec::CSTOverlay::update(CSTOverlay *this,HLPBindingMap *map,_Fact *input,_Fact *bound_pattern)

{
  bool bVar1;
  Pred *this_00;
  _Fact *this_01;
  reference p;
  float fVar2;
  pair<std::__detail::_Node_iterator<core::P<r_exec::Sim>,_true,_true>,_bool> pVar3;
  P<r_exec::_Fact> local_88;
  _Node_iterator_base<core::P<r_exec::Sim>,_true> local_80;
  undefined1 local_78;
  P<r_exec::Sim> local_70;
  P<r_exec::Sim> simulation;
  iterator __end3;
  iterator __begin3;
  vector<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_> *__range3;
  Pred *prediction;
  double last_cfd;
  P<r_exec::_Fact> local_30;
  _Fact *local_28;
  _Fact *bound_pattern_local;
  _Fact *input_local;
  HLPBindingMap *map_local;
  CSTOverlay *this_local;
  
  local_28 = bound_pattern;
  bound_pattern_local = input;
  input_local = (_Fact *)map;
  map_local = (HLPBindingMap *)this;
  core::P<r_exec::HLPBindingMap>::operator=(&(this->super_HLPOverlay).bindings,map);
  core::P<r_exec::_Fact>::P(&local_30,bound_pattern_local);
  std::vector<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>::push_back
            (&this->inputs,&local_30);
  core::P<r_exec::_Fact>::~P(&local_30);
  this_00 = _Fact::get_pred(bound_pattern_local);
  if (this_00 == (Pred *)0x0) {
    fVar2 = _Fact::get_cfd(bound_pattern_local);
  }
  else {
    this_01 = Pred::get_target(this_00);
    fVar2 = _Fact::get_cfd(this_01);
    bVar1 = Pred::is_simulation(this_00);
    if (bVar1) {
      __end3 = std::vector<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>::begin
                         (&this_00->simulations);
      simulation.object =
           (_Object *)
           std::vector<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>::end
                     (&this_00->simulations);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<core::P<r_exec::Sim>_*,_std::vector<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>_>
                                         *)&simulation), bVar1) {
        p = __gnu_cxx::
            __normal_iterator<core::P<r_exec::Sim>_*,_std::vector<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>_>
            ::operator*(&__end3);
        core::P<r_exec::Sim>::P(&local_70,p);
        pVar3 = std::
                unordered_set<core::P<r_exec::Sim>,_r_code::PHash<r_exec::Sim>,_std::equal_to<core::P<r_exec::Sim>_>,_std::allocator<core::P<r_exec::Sim>_>_>
                ::insert(&this->simulations,&local_70);
        local_80._M_cur =
             (__node_type *)pVar3.first.super__Node_iterator_base<core::P<r_exec::Sim>,_true>._M_cur
        ;
        local_78 = pVar3.second;
        core::P<r_exec::Sim>::~P(&local_70);
        __gnu_cxx::
        __normal_iterator<core::P<r_exec::Sim>_*,_std::vector<core::P<r_exec::Sim>,_std::allocator<core::P<r_exec::Sim>_>_>_>
        ::operator++(&__end3);
      }
    }
    else {
      core::P<r_exec::_Fact>::P(&local_88,bound_pattern_local);
      std::
      unordered_set<core::P<r_exec::_Fact>,_r_code::PHash<r_exec::_Fact>,_std::equal_to<core::P<r_exec::_Fact>_>,_std::allocator<core::P<r_exec::_Fact>_>_>
      ::insert(&this->predictions,&local_88);
      core::P<r_exec::_Fact>::~P(&local_88);
    }
  }
  prediction = (Pred *)(double)fVar2;
  if ((double)prediction < this->lowest_cfd) {
    this->lowest_cfd = (double)prediction;
  }
  return;
}

Assistant:

void CSTOverlay::update(HLPBindingMap *map, _Fact *input, _Fact *bound_pattern)
{
    bindings = map;
    inputs.push_back(input);
    double last_cfd;
    Pred *prediction = input->get_pred();

    if (prediction) {
        last_cfd = prediction->get_target()->get_cfd();

        if (prediction->is_simulation()) {
            for (P<Sim> simulation : prediction->simulations) {
                simulations.insert(simulation);
            }
        } else {
            predictions.insert(input);
        }
    } else {
        last_cfd = input->get_cfd();
    }

    if (lowest_cfd > last_cfd) {
        lowest_cfd = last_cfd;
    }
}